

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O1

void sendComplete(void *context,IO_SEND_RESULT send_result)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                 ,"sendComplete",0xed,1,"MQTT Send Complete Failure with NULL mqtt_client");
      return;
    }
  }
  else {
    if (send_result == IO_SEND_ERROR) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                   ,"sendComplete",0xe7,1,"MQTT Send Complete Failure send_result: %d",2);
      }
      if (*(code **)((long)context + 0x40) != (code *)0x0) {
        (**(code **)((long)context + 0x40))(context,4,*(undefined8 *)((long)context + 0x48));
      }
      close_connection((MQTT_CLIENT *)context);
      return;
    }
    if ((send_result == IO_SEND_OK) && (*(int *)((long)context + 0x10) == 0xe0)) {
      if (*(code **)((long)context + 0x28) != (code *)0x0) {
        (**(code **)((long)context + 0x28))(context,9,0,*(undefined8 *)((long)context + 0x38));
      }
      *(byte *)((long)context + 0xa0) = *(byte *)((long)context + 0xa0) | 4;
    }
  }
  return;
}

Assistant:

static void sendComplete(void* context, IO_SEND_RESULT send_result)
{
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)context;
    if (mqtt_client != NULL)
    {
        if (send_result == IO_SEND_OK)
        {
            if (mqtt_client->packetState == DISCONNECT_TYPE)
            {
                /*Codes_SRS_MQTT_CLIENT_07_032: [If the actionResult parameter is of type MQTT_CLIENT_ON_DISCONNECT the the msgInfo value shall be NULL.]*/
                if (mqtt_client->fnOperationCallback != NULL)
                {
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_DISCONNECT, NULL, mqtt_client->ctx);
                }

                // Mark to close
                mqtt_client->mqtt_status |= MQTT_STATUS_PENDING_CLOSE;
            }
        }
        else if (send_result == IO_SEND_ERROR)
        {
            LogError("MQTT Send Complete Failure send_result: %d", (int)send_result);
            set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
        }
    }
    else
    {
        LogError("MQTT Send Complete Failure with NULL mqtt_client");
    }
}